

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer.cpp
# Opt level: O2

void __thiscall argo::pointer::build_from_uri_fragment(pointer *this,string *pointer)

{
  bool bVar1;
  string *this_00;
  size_t end;
  size_t start;
  size_t local_70 [2];
  undefined1 local_60 [8];
  _Alloc_hider local_58;
  size_type local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  size_t local_38;
  
  local_70[0] = 0;
  local_70[1] = 1;
  if (pointer->_M_string_length == 1) {
    local_60._0_4_ = all_e;
    local_58._M_p = (pointer)&local_48;
    local_50 = 0;
    local_48._M_local_buf[0] = '\0';
    local_38 = 0;
    std::__cxx11::list<argo::pointer::token,_std::allocator<argo::pointer::token>_>::push_back
              (&this->m_path,(value_type *)local_60);
    std::__cxx11::string::~string((string *)&local_58);
  }
  else {
    this_00 = (string *)this;
    while( true ) {
      bVar1 = next_token((pointer *)this_00,pointer,local_70 + 1,local_70);
      if (!bVar1) break;
      translate_uri_token((token *)local_60,this,pointer,local_70 + 1,local_70);
      std::__cxx11::list<argo::pointer::token,_std::allocator<argo::pointer::token>_>::push_back
                (&this->m_path,(token *)local_60);
      this_00 = (string *)&local_58;
      std::__cxx11::string::~string((string *)&local_58);
    }
  }
  return;
}

Assistant:

void pointer::build_from_uri_fragment(const std::string &pointer)
{
    size_t start = 1;
    size_t end = 0;

    if (pointer.size() == 1)
    {
        m_path.push_back(token());
    }
    else
    {
        while (next_token(pointer, start, end))
        {
            m_path.push_back(translate_uri_token(pointer, start, end));
        }
    }
}